

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::ToInt32Dst(GlobOpt *this,Instr *instr,RegOpnd *dst,BasicBlock *block)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  Opnd *this_01;
  RegOpnd *newDst;
  
  this_00 = dst->m_sym;
  if ((this_00->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3047,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->prePassLoop == (Loop *)0x0) && (this_00->m_type == TyVar)) {
    pSVar4 = StackSym::GetInt32EquivSym(this_00,instr->m_func);
    this_01 = IR::Instr::UnlinkDst(instr);
    newDst = IR::Opnd::AsRegOpnd(this_01);
    newDst->m_sym = pSVar4;
    (newDst->super_Opnd).m_type = TyInt32;
    IR::Instr::SetDst(instr,&newDst->super_Opnd);
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            ((block->globOptData).liveInt32Syms,(this_00->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveLossyInt32Syms,(this_00->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveVarSyms,(this_00->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveFloat64Syms,(this_00->super_Sym).m_id);
  return;
}

Assistant:

void
GlobOpt::ToInt32Dst(IR::Instr *instr, IR::RegOpnd *dst, BasicBlock *block)
{
    StackSym *varSym = dst->m_sym;
    Assert(!varSym->IsTypeSpec());

    if (!this->IsLoopPrePass() && varSym->IsVar())
    {
        StackSym *int32Sym = varSym->GetInt32EquivSym(instr->m_func);

        // Use UnlinkDst / SetDst to make sure isSingleDef is tracked properly,
        // since we'll just be hammering the symbol.
        dst = instr->UnlinkDst()->AsRegOpnd();
        dst->m_sym = int32Sym;
        dst->SetType(TyInt32);
        instr->SetDst(dst);
    }

    block->globOptData.liveInt32Syms->Set(varSym->m_id);
    block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id); // The store makes it lossless
    block->globOptData.liveVarSyms->Clear(varSym->m_id);
    block->globOptData.liveFloat64Syms->Clear(varSym->m_id);
}